

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

bool __thiscall chatra::Thread::callOperator(Thread *this)

{
  TemporaryObject *this_00;
  bool bVar1;
  EvaluateValueResult EVar2;
  reference pvVar3;
  vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_> *pvVar4;
  reference ppTVar5;
  __shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2> *p_Var6;
  element_type *peVar7;
  reference ppTVar8;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> local_88;
  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
  local_70;
  __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
  local_68;
  Reference local_60;
  Tuple *local_58;
  Tuple *tuple;
  element_type *local_48;
  int local_3c;
  element_type *local_38;
  unsigned_long *local_30;
  unsigned_long *nodePhase;
  Node *node;
  value_type *f;
  Thread *this_local;
  
  f = (value_type *)this;
  node = (Node *)std::vector<chatra::Frame,_std::allocator<chatra::Frame>_>::back(&this->frames);
  pvVar3 = std::
           vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ::back(&((reference)node)->stack);
  nodePhase = (unsigned_long *)pvVar3->first;
  pvVar3 = std::
           vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ::back((vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                   *)&node->annotations);
  local_30 = &pvVar3->second;
  switch(*local_30) {
  case 0:
    *local_30 = *local_30 + 1;
    pvVar4 = &node->annotations;
    p_Var6 = &std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            *)(nodePhase + 0xc),1)->
              super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
    local_38 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var6);
    local_3c = 0;
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,int>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)pvVar4,&local_38,&local_3c);
    break;
  case 1:
    EVar2 = evaluateValue(this,Value);
    if (EVar2 == Suspend) {
      return false;
    }
    if (EVar2 == StackChanged) {
      return true;
    }
  case 2:
    *local_30 = *local_30 + 1;
    pvVar4 = &node->annotations;
    p_Var6 = &std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            *)(nodePhase + 0xc),0)->
              super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
    local_48 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var6);
    tuple._4_4_ = 0;
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,int>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)pvVar4,&local_48,(int *)((long)&tuple + 4));
    break;
  case 3:
    ppTVar8 = std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
              back((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_> *)
                   &node->additionalTokens);
    bVar1 = TemporaryObject::hasArguments(*ppTVar8);
    if (bVar1) {
      EVar2 = evaluateValue(this,Value);
      if (EVar2 == Suspend) {
        return false;
      }
      if (EVar2 == StackChanged) {
        return true;
      }
    }
    else {
      *local_30 = *local_30 + 1;
    }
  default:
    local_70._M_current =
         (TemporaryObject **)
         std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::end
                   ((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_> *
                    )&node->additionalTokens);
    local_68 = __gnu_cxx::
               __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
               ::operator-(&local_70,2);
    ppTVar5 = __gnu_cxx::
              __normal_iterator<chatra::TemporaryObject_**,_std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>_>
              ::operator*(&local_68);
    local_60 = TemporaryObject::getRef(*ppTVar5);
    local_58 = Reference::deref<chatra::Tuple>(&local_60);
    p_Var6 = &std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            *)(nodePhase + 0xc),1)->
              super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
    peVar7 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var6);
    checkTupleAsArgOrThrow(this,peVar7,local_58);
    ppTVar8 = std::vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>::
              back((vector<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_> *)
                   &node->additionalTokens);
    this_00 = *ppTVar8;
    p_Var6 = &std::
              vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
              ::operator[]((vector<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                            *)(nodePhase + 0xc),1)->
              super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>;
    peVar7 = std::__shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>::get(p_Var6);
    Tuple::toArgs(&local_88,local_58);
    TemporaryObject::addArgument(this_00,peVar7,&local_88);
    std::vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>::~vector(&local_88);
    std::
    vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
    ::pop_back((vector<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
                *)&node->annotations);
  }
  return true;
}

Assistant:

bool Thread::callOperator() {
	auto& f = frames.back();
	auto* node = f.stack.back().first;
	auto& nodePhase = f.stack.back().second;

	switch (nodePhase) {
	case 0:  nodePhase++;  f.stack.emplace_back(node->subNodes[1].get(), 0);  return true;
	case 1:  CHATRA_EVALUATE_VALUE;
	case 2:  nodePhase++;  f.stack.emplace_back(node->subNodes[0].get(), 0);  return true;
	case 3:
		// To evaluate the case of "foo(...)(...)" which "foo(...)" returns an object
		if (!f.values.back()->hasArguments())
			nodePhase++;
		else
			CHATRA_EVALUATE_VALUE;
	default: {
		auto& tuple = (*(f.values.end() - 2))->getRef().deref<Tuple>();
		checkTupleAsArgOrThrow(node->subNodes[1].get(), tuple);
		f.values.back()->addArgument(node->subNodes[1].get(), tuple.toArgs());
		f.stack.pop_back();
		return true;
	}
	}
}